

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O3

size_t rtosc_bundle(char *buffer,size_t len,uint64_t tt,int elms,...)

{
  char *__src;
  char in_AL;
  uint uVar1;
  void **ppvVar2;
  ulong uVar3;
  void **ppvVar4;
  size_t __n;
  undefined8 in_R8;
  undefined8 in_R9;
  uint *puVar5;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  uint local_138;
  ring_t local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_c8 = in_R8;
  local_c0 = in_R9;
  memset(buffer,0,len);
  buffer[0] = '#';
  buffer[1] = 'b';
  buffer[2] = 'u';
  buffer[3] = 'n';
  buffer[4] = 'd';
  buffer[5] = 'l';
  buffer[6] = 'e';
  buffer[7] = '\0';
  buffer[8] = (char)(tt >> 0x38);
  buffer[9] = (char)(tt >> 0x30);
  buffer[10] = (char)(tt >> 0x28);
  buffer[0xb] = (char)(tt >> 0x20);
  buffer[0xc] = (char)(tt >> 0x18);
  buffer[0xd] = (char)(tt >> 0x10);
  buffer[0xe] = (char)(tt >> 8);
  buffer[0xf] = (char)tt;
  puVar5 = (uint *)(buffer + 0x10);
  ppvVar2 = &va[0].overflow_arg_area;
  if (0 < elms) {
    local_138 = 0x20;
    do {
      if (local_138 < 0x29) {
        uVar3 = (ulong)local_138;
        local_138 = local_138 + 8;
        ppvVar4 = (void **)((long)local_e8 + uVar3);
      }
      else {
        ppvVar4 = ppvVar2;
        ppvVar2 = ppvVar2 + 1;
      }
      __src = (char *)*ppvVar4;
      local_108.len = 0xffffffffffffffff;
      local_f8 = 0;
      uStack_f0 = 0;
      local_108.data = __src;
      __n = rtosc_message_ring_length(&local_108);
      uVar1 = (uint)__n;
      *puVar5 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      memcpy(puVar5 + 1,__src,__n);
      puVar5 = (uint *)((long)puVar5 + __n + 4);
      elms = elms + -1;
    } while (elms != 0);
  }
  return (long)puVar5 - (long)buffer;
}

Assistant:

size_t rtosc_bundle(char *buffer, size_t len, uint64_t tt, int elms, ...)
{
    char *_buffer = buffer;
    memset(buffer, 0, len);
    strcpy(buffer, "#bundle");
    buffer += 8;
    emplace_uint64((uint8_t*)buffer, tt);
    buffer += 8;
    va_list va;
    va_start(va, elms);
    for(int i=0; i<elms; ++i) {
        const char   *msg  = va_arg(va, const char*);
        //It is assumed that any passed message/bundle is valid
        size_t        size = rtosc_message_length(msg, -1);
        emplace_uint32((uint8_t*)buffer, size);
        buffer += 4;
        memcpy(buffer, msg, size);
        buffer+=size;
    }
    va_end(va);

    return buffer-_buffer;
}